

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagegenerator.cpp
# Opt level: O3

void __thiscall
stackjit::AssemblyImageGenerator::generateFunctionBody
          (AssemblyImageGenerator *this,BinaryData *data,Function *function)

{
  pointer *ppcVar1;
  pointer pbVar2;
  Instruction *pIVar3;
  iterator iVar4;
  InstructionFormats IVar5;
  char value;
  AttributeContainer *attributes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_> *pvVar7;
  string *psVar8;
  Function *this_00;
  size_t i;
  long lVar9;
  pointer pbVar10;
  Instruction *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local;
  OpCodes local_39;
  int local_38;
  float local_34;
  
  this_00 = function;
  attributes = Loader::Function::attributes_abi_cxx11_(function);
  generateAttributes((AssemblyImageGenerator *)this_00,data,attributes);
  pvVar6 = Loader::Function::localTypes_abi_cxx11_(function);
  anon_unknown_3::addData<unsigned_long>
            (data,(long)(pvVar6->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar6->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5);
  pvVar6 = Loader::Function::localTypes_abi_cxx11_(function);
  pbVar2 = (pvVar6->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar10 = (pvVar6->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar2;
      pbVar10 = pbVar10 + 1) {
    anon_unknown_3::addString(data,pbVar10);
  }
  pvVar7 = Loader::Function::instructions(function);
  anon_unknown_3::addData<unsigned_long>
            (data,((long)(pvVar7->
                         super__Vector_base<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar7->
                         super__Vector_base<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5);
  pvVar7 = Loader::Function::instructions(function);
  pIVar3 = (pvVar7->
           super__Vector_base<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (pvVar7->
                 super__Vector_base<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                 )._M_impl.super__Vector_impl_data._M_start; this_01 != pIVar3;
      this_01 = this_01 + 1) {
    IVar5 = Loader::Instruction::format(this_01);
    anon_unknown_3::addData<char>(data,IVar5);
    local_39 = Loader::Instruction::opCode(this_01);
    iVar4._M_current =
         (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar4._M_current ==
        (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                ((vector<char,std::allocator<char>> *)data,iVar4,(char *)&local_39);
    }
    else {
      *iVar4._M_current = local_39;
      ppcVar1 = &(data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
    IVar5 = Loader::Instruction::format(this_01);
    switch(IVar5) {
    case IntData:
      local_38 = Loader::Instruction::intValue(this_01);
      lVar9 = 0;
      do {
        iVar4._M_current =
             (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
        if (iVar4._M_current ==
            (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)data,iVar4,
                     (char *)((long)&local_38 + lVar9));
        }
        else {
          *iVar4._M_current = *(char *)((long)&local_38 + lVar9);
          ppcVar1 = &(data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      break;
    case FloatData:
      local_34 = Loader::Instruction::floatValue(this_01);
      lVar9 = 0;
      do {
        iVar4._M_current =
             (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
        if (iVar4._M_current ==
            (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)data,iVar4,
                     (char *)((long)&local_34 + lVar9));
        }
        else {
          *iVar4._M_current = *(char *)((long)&local_34 + lVar9);
          ppcVar1 = &(data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      break;
    case CharData:
      value = Loader::Instruction::charValue(this_01);
      anon_unknown_3::addData<char>(data,value);
      break;
    case StringData:
    case StringConstantData:
      psVar8 = Loader::Instruction::stringValue_abi_cxx11_(this_01);
      anon_unknown_3::addString(data,psVar8);
      break;
    case Call:
      psVar8 = Loader::Instruction::stringValue_abi_cxx11_(this_01);
      anon_unknown_3::addString(data,psVar8);
      pvVar6 = Loader::Instruction::callParameters_abi_cxx11_(this_01);
      anon_unknown_3::addData<unsigned_long>
                (data,(long)(pvVar6->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar6->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5);
      pvVar6 = Loader::Instruction::callParameters_abi_cxx11_(this_01);
      pbVar2 = (pvVar6->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar10 = (pvVar6->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar2;
          pbVar10 = pbVar10 + 1) {
        anon_unknown_3::addString(data,pbVar10);
      }
      break;
    case CallInstance:
      psVar8 = Loader::Instruction::stringValue_abi_cxx11_(this_01);
      anon_unknown_3::addString(data,psVar8);
      psVar8 = Loader::Instruction::calledClassType_abi_cxx11_(this_01);
      anon_unknown_3::addString(data,psVar8);
      pvVar6 = Loader::Instruction::callParameters_abi_cxx11_(this_01);
      anon_unknown_3::addData<unsigned_long>
                (data,(long)(pvVar6->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar6->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5);
      pvVar6 = Loader::Instruction::callParameters_abi_cxx11_(this_01);
      pbVar2 = (pvVar6->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar10 = (pvVar6->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar2;
          pbVar10 = pbVar10 + 1) {
        anon_unknown_3::addString(data,pbVar10);
      }
    }
  }
  return;
}

Assistant:

void AssemblyImageGenerator::generateFunctionBody(BinaryData& data, Loader::Function& function) {
		//Attributes
		generateAttributes(data, function.attributes());

		//Locals
		addData<std::size_t>(data, function.localTypes().size());
		for (auto& local : function.localTypes()) {
			addString(data, local);
		}

		//Body
		addData<std::size_t>(data, function.instructions().size());

		for (auto& instruction : function.instructions()) {
			addData<char>(data, (char)instruction.format());
			addData<unsigned char>(data, (unsigned char)instruction.opCode());

			switch (instruction.format()) {
				case Loader::InstructionFormats::OpCodeOnly:
					break;
				case Loader::InstructionFormats::IntData:
					addData(data, instruction.intValue());
					break;
				case Loader::InstructionFormats::FloatData:
					addData(data, instruction.floatValue());
					break;
				case Loader::InstructionFormats::CharData:
					addData(data, instruction.charValue());
					break;
				case Loader::InstructionFormats::StringData:
					addString(data, instruction.stringValue());
					break;
				case Loader::InstructionFormats::StringConstantData:
					addString(data, instruction.stringValue());
					break;
				case Loader::InstructionFormats::Call:
					addString(data, instruction.stringValue());
					addData(data, instruction.callParameters().size());

					for (auto& param : instruction.callParameters()) {
						addString(data, param);
					}
					break;
				case Loader::InstructionFormats::CallInstance:
					addString(data, instruction.stringValue());
					addString(data, instruction.calledClassType());
					addData(data, instruction.callParameters().size());

					for (auto& parameter : instruction.callParameters()) {
						addString(data, parameter);
					}
					break;
			}
		}
	}